

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft,jx9_hashmap_node *pRight,int bStrict)

{
  undefined1 local_a8 [4];
  sxi32 rc;
  jx9_value sObj2;
  jx9_value sObj1;
  int bStrict_local;
  jx9_hashmap_node *pRight_local;
  jx9_hashmap_node *pLeft_local;
  
  if (pLeft == pRight) {
    pLeft_local._4_4_ = 0;
  }
  else {
    jx9MemObjInit(pLeft->pMap->pVm,(jx9_value *)&sObj2.nIdx);
    jx9MemObjInit(pLeft->pMap->pVm,(jx9_value *)local_a8);
    jx9HashmapExtractNodeValue(pLeft,(jx9_value *)&sObj2.nIdx,0);
    jx9HashmapExtractNodeValue(pRight,(jx9_value *)local_a8,0);
    pLeft_local._4_4_ = jx9MemObjCmp((jx9_value *)&sObj2.nIdx,(jx9_value *)local_a8,bStrict,0);
    jx9MemObjRelease((jx9_value *)&sObj2.nIdx);
    jx9MemObjRelease((jx9_value *)local_a8);
  }
  return pLeft_local._4_4_;
}

Assistant:

static sxi32 HashmapNodeCmp(jx9_hashmap_node *pLeft, jx9_hashmap_node *pRight, int bStrict)
{
	jx9_value sObj1, sObj2;
	sxi32 rc;
	if( pLeft == pRight ){
		/*
		 * Same node.Refer to the sort() implementation defined
		 * below for more information on this sceanario.
		 */
		return 0;
	}
	/* Do the comparison */
	jx9MemObjInit(pLeft->pMap->pVm, &sObj1);
	jx9MemObjInit(pLeft->pMap->pVm, &sObj2);
	jx9HashmapExtractNodeValue(pLeft, &sObj1, FALSE);
	jx9HashmapExtractNodeValue(pRight, &sObj2, FALSE);
	rc = jx9MemObjCmp(&sObj1, &sObj2, bStrict, 0);
	jx9MemObjRelease(&sObj1);
	jx9MemObjRelease(&sObj2);
	return rc;
}